

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O2

int Aig_ManChoiceLevel(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  int iVar4;
  
  for (iVar3 = 0; iVar3 < p->vObjs->nSize; iVar3 = iVar3 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,iVar3);
    if (pAVar2 != (Aig_Obj_t *)0x0) {
      Aig_ObjSetLevel(pAVar2,0);
    }
  }
  Aig_ManSetCioIds(p);
  Aig_ManIncrementTravId(p);
  iVar3 = 0;
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,iVar4);
    Aig_ManChoiceLevel_rec(p,pAVar2);
    iVar1 = Aig_ObjLevel(pAVar2);
    if (iVar3 < iVar1) {
      iVar3 = Aig_ObjLevel(pAVar2);
    }
  }
  for (iVar4 = 0; iVar4 < p->vCis->nSize; iVar4 = iVar4 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,iVar4);
    Aig_ManChoiceLevel_rec(p,pAVar2);
    iVar1 = Aig_ObjLevel(pAVar2);
    if (iVar3 < iVar1) {
      iVar3 = Aig_ObjLevel(pAVar2);
    }
  }
  Aig_ManCleanCioIds(p);
  return iVar3;
}

Assistant:

int Aig_ManChoiceLevel( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, LevelMax = 0;
    Aig_ManForEachObj( p, pObj, i )
        Aig_ObjSetLevel( pObj, 0 );
    Aig_ManSetCioIds( p );
    Aig_ManIncrementTravId( p );
    Aig_ManForEachCo( p, pObj, i )
    {
        Aig_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Aig_ObjLevel(pObj) )
            LevelMax = Aig_ObjLevel(pObj);
    }
    // account for dangling boxes
    Aig_ManForEachCi( p, pObj, i )
    {
        Aig_ManChoiceLevel_rec( p, pObj );
        if ( LevelMax < Aig_ObjLevel(pObj) )
            LevelMax = Aig_ObjLevel(pObj);
    }
    Aig_ManCleanCioIds( p );
//    Aig_ManForEachNode( p, pObj, i )
//        assert( Aig_ObjLevel(pObj) > 0 );
    return LevelMax;
}